

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

void __thiscall
Validator_unnamedModelWithUnnamedComponentWithUnnamedUnits_Test::
~Validator_unnamedModelWithUnnamedComponentWithUnnamedUnits_Test
          (Validator_unnamedModelWithUnnamedComponentWithUnnamedUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, unnamedModelWithUnnamedComponentWithUnnamedUnits)
{
    const std::vector<std::string> expectedIssues = {
        "Model '' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "Component '' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "Units '' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
    };

    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr component = libcellml::Component::create();
    libcellml::UnitsPtr units = libcellml::Units::create();
    model->addComponent(component);
    model->addUnits(units);
    validator->validateModel(model);

    EXPECT_EQ_ISSUES(expectedIssues, validator);
}